

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

ostream * operator<<(ostream *stream,NumberFormatter *formatter)

{
  uint uVar1;
  ostream *this;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = *(uint *)(&stream->field_0x18 + (long)stream->_vptr_basic_ostream[-3]);
  if (formatter->Format == FORMAT_DECIMAL) {
    puVar2 = (uint *)(&stream->field_0x18 + (long)stream->_vptr_basic_ostream[-3]);
    uVar4 = 2;
    this = stream;
    uVar3 = uVar1;
  }
  else {
    this = std::operator<<(stream,"0x");
    puVar2 = (uint *)(&this->field_0x18 + (long)this->_vptr_basic_ostream[-3]);
    uVar4 = 8;
    uVar3 = *puVar2;
  }
  *puVar2 = uVar3 & 0xffffffb5 | uVar4;
  std::ostream::operator<<(this,formatter->Value);
  *(uint *)(&stream->field_0x18 + (long)stream->_vptr_basic_ostream[-3]) = uVar1;
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream,
                         NumberFormatter const& formatter)
{
  auto const& flags = stream.flags();
  if (formatter.Format == FORMAT_DECIMAL) {
    stream << std::dec << formatter.Value;
  } else {
    stream << "0x" << std::hex << formatter.Value;
  }
  stream.flags(flags);
  return stream;
}